

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_vsprintf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *zIn;
  int local_64;
  int n;
  int nLen;
  SySet sArg;
  jx9_hashmap *pMap;
  char *zFormat;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (((1 < nArg) && (iVar1 = jx9_value_is_string(*apArg), iVar1 != 0)) &&
     (iVar1 = jx9_value_is_json_array(apArg[1]), iVar1 != 0)) {
    zIn = jx9_value_to_string(*apArg,&local_64);
    if (local_64 < 1) {
      jx9_result_string(pCtx,"",0);
      return 0;
    }
    sArg.pUserData = (apArg[1]->x).pOther;
    iVar1 = jx9HashmapValuesToSet((jx9_hashmap *)sArg.pUserData,(SySet *)&n);
    jx9InputFormat(sprintfConsumer,pCtx,zIn,local_64,iVar1,(jx9_value **)sArg.pAllocator,(void *)0x0
                   ,1);
    SySetRelease((SySet *)&n);
    return 0;
  }
  jx9_result_string(pCtx,"",0);
  return 0;
}

Assistant:

static int jx9Builtin_vsprintf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	jx9_hashmap *pMap;
	SySet sArg;
	int nLen, n;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) || !jx9_value_is_json_array(apArg[1]) ){
		/* Missing/Invalid arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Point to hashmap */
	pMap = (jx9_hashmap *)apArg[1]->x.pOther;
	/* Extract arguments from the hashmap */
	n = jx9HashmapValuesToSet(pMap, &sArg);
	/* Format the string */
	jx9InputFormat(sprintfConsumer, pCtx, zFormat, nLen, n, (jx9_value **)SySetBasePtr(&sArg), 0, TRUE);
	/* Release the container */
	SySetRelease(&sArg);
	return JX9_OK;
}